

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O0

void test_bson_document(void)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  int __fd;
  bson_t *_t;
  undefined8 uVar4;
  bson_t *pbVar5;
  undefined8 uVar6;
  void *__buf;
  void *__buf_00;
  void *__s1;
  void *__s2;
  ulong uVar7;
  bool bVar8;
  int fd2;
  int fd1;
  int off;
  uint o;
  int unequal;
  uint8_t *expected_data;
  uint8_t *bson_data;
  char *expected_json;
  char *bson_json;
  bson_t *bcon;
  bson_t *child;
  bson_t ochild;
  uint32_t local_1f8;
  uint local_1bc;
  uint local_1b8;
  bson_t local_180 [2];
  
  _t = (bson_t *)bcon_new(0,"bar","baz");
  uVar4 = bson_bcon_magic();
  pbVar5 = bcon_ensure_const_bson_ptr(_t);
  uVar4 = bcon_new(0,"foo",uVar4,2,pbVar5);
  uVar6 = bson_bcone_magic();
  pbVar5 = bcon_ensure_bson_ptr(local_180);
  bVar2 = bcon_extract(uVar4,"foo",uVar6,2,pbVar5,0);
  if ((bVar2 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x131,"test_bson_document","BCON_EXTRACT (bcon, \"foo\", BCONE_DOCUMENT (ochild))");
    abort();
  }
  __buf = (void *)bson_get_data(local_180);
  __buf_00 = (void *)bson_get_data(_t);
  local_1bc = 0xffffffff;
  bVar8 = true;
  if (_t->len == local_180[0].len) {
    __s1 = (void *)bson_get_data(_t);
    __s2 = (void *)bson_get_data(local_180);
    iVar3 = memcmp(__s1,__s2,(ulong)_t->len);
    bVar8 = iVar3 != 0;
  }
  if (!bVar8) {
    bson_destroy(local_180);
    bson_destroy(_t);
    bson_destroy(uVar4);
    return;
  }
  uVar4 = bson_as_canonical_extended_json(local_180,0);
  uVar6 = bson_as_canonical_extended_json(_t,0);
  local_1b8 = 0;
  while( true ) {
    bVar8 = false;
    if (local_1b8 < local_180[0].len) {
      bVar8 = local_1b8 < _t->len;
    }
    if (!bVar8) goto LAB_00148a2c;
    if (*(char *)((long)__buf + (ulong)local_1b8) != *(char *)((long)__buf_00 + (ulong)local_1b8))
    break;
    local_1b8 = local_1b8 + 1;
  }
  local_1bc = local_1b8;
LAB_00148a2c:
  if (local_1bc == 0xffffffff) {
    if (local_180[0].len < _t->len) {
      local_1f8 = _t->len;
    }
    else {
      local_1f8 = local_180[0].len;
    }
    local_1bc = local_1f8 - 1;
  }
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)local_1bc,uVar4,uVar6);
  iVar3 = open("failure.bad.bson",0x42,0x1a0);
  __fd = open("failure.expected.bson",0x42,0x1a0);
  if (iVar3 == -1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x133,"test_bson_document","fd1 != -1");
    abort();
  }
  if (__fd == -1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x133,"test_bson_document","fd2 != -1");
    abort();
  }
  uVar7 = write(iVar3,__buf,(ulong)local_180[0].len);
  if (local_180[0].len == uVar7) {
    uVar1 = _t->len;
    uVar7 = write(__fd,__buf_00,(ulong)_t->len);
    if (uVar1 == uVar7) {
      close(iVar3);
      close(__fd);
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
              ,0x133,"test_bson_document","0");
      abort();
    }
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x133,"test_bson_document",
            "(child)->len == bson_write (fd2, expected_data, (child)->len)");
    abort();
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
          ,0x133,"test_bson_document",
          "(&ochild)->len == bson_write (fd1, bson_data, (&ochild)->len)");
  abort();
}

Assistant:

static void
test_bson_document (void)
{
   bson_t ochild;
   bson_t *child = BCON_NEW ("bar", "baz");
   bson_t *bcon = BCON_NEW ("foo", BCON_DOCUMENT (child));

   BSON_ASSERT (BCON_EXTRACT (bcon, "foo", BCONE_DOCUMENT (ochild)));

   bson_eq_bson (&ochild, child);

   bson_destroy (&ochild);
   bson_destroy (child);
   bson_destroy (bcon);
}